

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::ArenaTest_CleanupDestructionOrder_Test::TestBody
          (ArenaTest_CleanupDestructionOrder_Test *this)

{
  ElementsAreMatcher<std::tuple<int,_int,_int>_> matcher;
  bool bVar1;
  char *message;
  undefined8 in_stack_fffffffffffffeb4;
  AssertHelper local_130;
  Message local_128;
  int local_11c [3];
  testing local_110 [8];
  _Tuple_impl<2UL,_int> local_108;
  char local_104 [12];
  undefined1 local_f8 [8];
  AssertionResult gtest_ar;
  int local_e0 [2];
  int i;
  undefined1 local_d0 [8];
  Arena arena;
  vector<int,_std::allocator<int>_> destroy_order;
  ArenaTest_CleanupDestructionOrder_Test *this_local;
  
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&arena.impl_.first_arena_.cached_blocks_);
  Arena::Arena((Arena *)local_d0);
  for (local_e0[0] = 0; local_e0[0] < 3; local_e0[0] = local_e0[0] + 1) {
    gtest_ar.message_._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )&arena.impl_.first_arena_.cached_blocks_;
    Arena::Create<google::protobuf::DestroyOrderRecorder,std::vector<int,std::allocator<int>>*,int&>
              ((Arena *)local_d0,(vector<int,_std::allocator<int>_> **)&gtest_ar.message_,local_e0);
  }
  Arena::~Arena((Arena *)local_d0);
  local_11c[2] = 2;
  local_11c[1] = 1;
  local_11c[0] = 0;
  testing::ElementsAre<int,int,int>(local_110,local_11c + 2,local_11c + 1,local_11c);
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = (int)in_stack_fffffffffffffeb4;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
  _M_head_impl = (int)((ulong)in_stack_fffffffffffffeb4 >> 0x20);
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       local_108.super__Head_base<2UL,_int,_false>._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int>>>
            (matcher);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int>>>::
  operator()(local_f8,local_104,(vector<int,_std::allocator<int>_> *)"destroy_order");
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_f8);
  if (!bVar1) {
    testing::Message::Message(&local_128);
    message = testing::AssertionResult::failure_message((AssertionResult *)local_f8);
    testing::internal::AssertHelper::AssertHelper
              (&local_130,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/arena_unittest.cc"
               ,0x713,message);
    testing::internal::AssertHelper::operator=(&local_130,&local_128);
    testing::internal::AssertHelper::~AssertHelper(&local_130);
    testing::Message::~Message(&local_128);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_f8);
  std::vector<int,_std::allocator<int>_>::~vector
            ((vector<int,_std::allocator<int>_> *)&arena.impl_.first_arena_.cached_blocks_);
  return;
}

Assistant:

TEST(ArenaTest, CleanupDestructionOrder) {
  std::vector<int> destroy_order;
  {
    Arena arena;
    for (int i = 0; i < 3; i++) {
      Arena::Create<DestroyOrderRecorder>(&arena, &destroy_order, i);
    }
  }
  EXPECT_THAT(destroy_order, testing::ElementsAre(2, 1, 0));
}